

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_crypt_xts
              (mbedtls_aes_xts_context *ctx,int mode,size_t length,uchar *data_unit,uchar *input,
              uchar *output)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *local_b0;
  uchar *prev_output;
  size_t i_1;
  uchar *t;
  size_t i;
  uchar tmp [16];
  uchar prev_tweak [16];
  uchar tweak [16];
  size_t leftover;
  size_t blocks;
  uchar *puStack_40;
  int ret;
  uchar *output_local;
  uchar *input_local;
  uchar *data_unit_local;
  size_t length_local;
  int mode_local;
  mbedtls_aes_xts_context *ctx_local;
  
  leftover = length >> 4;
  puVar2 = (uchar *)(length & 0xf);
  if (length < 0x10) {
    ctx_local._4_4_ = -0x22;
  }
  else if (length < 0x1000001) {
    ctx_local._4_4_ = mbedtls_aes_crypt_ecb(&ctx->tweak,1,data_unit,prev_tweak + 8);
    puStack_40 = output;
    output_local = input;
    if (ctx_local._4_4_ == 0) {
      while (leftover != 0) {
        if (((puVar2 != (uchar *)0x0) && (mode == 0)) && (leftover - 1 == 0)) {
          tmp[8] = prev_tweak[8];
          tmp[9] = prev_tweak[9];
          tmp[10] = prev_tweak[10];
          tmp[0xb] = prev_tweak[0xb];
          tmp[0xc] = prev_tweak[0xc];
          tmp[0xd] = prev_tweak[0xd];
          tmp[0xe] = prev_tweak[0xe];
          tmp[0xf] = prev_tweak[0xf];
          mbedtls_gf128mul_x_ble(prev_tweak + 8,prev_tweak + 8);
        }
        for (t = (uchar *)0x0; t < (uchar *)0x10; t = t + 1) {
          *(uchar *)((long)&i + (long)t) = output_local[(long)t] ^ (prev_tweak + 8)[(long)t];
        }
        iVar1 = mbedtls_aes_crypt_ecb(&ctx->crypt,mode,(uchar *)&i,(uchar *)&i);
        if (iVar1 != 0) {
          return iVar1;
        }
        for (t = (uchar *)0x0; t < (uchar *)0x10; t = t + 1) {
          puStack_40[(long)t] = *(byte *)((long)&i + (long)t) ^ (prev_tweak + 8)[(long)t];
        }
        mbedtls_gf128mul_x_ble(prev_tweak + 8,prev_tweak + 8);
        puStack_40 = puStack_40 + 0x10;
        output_local = output_local + 0x10;
        leftover = leftover - 1;
      }
      if (puVar2 != (uchar *)0x0) {
        if (mode == 0) {
          local_b0 = tmp;
        }
        else {
          local_b0 = prev_tweak;
        }
        local_b0 = local_b0 + 8;
        puVar3 = puStack_40 + -0x10;
        for (prev_output = (uchar *)0x0; prev_output < puVar2; prev_output = prev_output + 1) {
          puStack_40[(long)prev_output] = puVar3[(long)prev_output];
          *(uchar *)((long)&i + (long)prev_output) =
               output_local[(long)prev_output] ^ local_b0[(long)prev_output];
        }
        for (; prev_output < (uchar *)0x10; prev_output = prev_output + 1) {
          *(uchar *)((long)&i + (long)prev_output) =
               puVar3[(long)prev_output] ^ local_b0[(long)prev_output];
        }
        iVar1 = mbedtls_aes_crypt_ecb(&ctx->crypt,mode,(uchar *)&i,(uchar *)&i);
        if (iVar1 != 0) {
          return iVar1;
        }
        for (prev_output = (uchar *)0x0; prev_output < (uchar *)0x10; prev_output = prev_output + 1)
        {
          puVar3[(long)prev_output] =
               *(byte *)((long)&i + (long)prev_output) ^ local_b0[(long)prev_output];
        }
      }
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ctx_local._4_4_ = -0x22;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_aes_crypt_xts( mbedtls_aes_xts_context *ctx,
                           int mode,
                           size_t length,
                           const unsigned char data_unit[16],
                           const unsigned char *input,
                           unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t blocks = length / 16;
    size_t leftover = length % 16;
    unsigned char tweak[16];
    unsigned char prev_tweak[16];
    unsigned char tmp[16];

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( mode == MBEDTLS_AES_ENCRYPT ||
                      mode == MBEDTLS_AES_DECRYPT );
    AES_VALIDATE_RET( data_unit != NULL );
    AES_VALIDATE_RET( input != NULL );
    AES_VALIDATE_RET( output != NULL );

    /* Data units must be at least 16 bytes long. */
    if( length < 16 )
        return MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH;

    /* NIST SP 800-38E disallows data units larger than 2**20 blocks. */
    if( length > ( 1 << 20 ) * 16 )
        return MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH;

    /* Compute the tweak. */
    ret = mbedtls_aes_crypt_ecb( &ctx->tweak, MBEDTLS_AES_ENCRYPT,
                                 data_unit, tweak );
    if( ret != 0 )
        return( ret );

    while( blocks-- )
    {
        size_t i;

        if( leftover && ( mode == MBEDTLS_AES_DECRYPT ) && blocks == 0 )
        {
            /* We are on the last block in a decrypt operation that has
             * leftover bytes, so we need to use the next tweak for this block,
             * and this tweak for the lefover bytes. Save the current tweak for
             * the leftovers and then update the current tweak for use on this,
             * the last full block. */
            memcpy( prev_tweak, tweak, sizeof( tweak ) );
            mbedtls_gf128mul_x_ble( tweak, tweak );
        }

        for( i = 0; i < 16; i++ )
            tmp[i] = input[i] ^ tweak[i];

        ret = mbedtls_aes_crypt_ecb( &ctx->crypt, mode, tmp, tmp );
        if( ret != 0 )
            return( ret );

        for( i = 0; i < 16; i++ )
            output[i] = tmp[i] ^ tweak[i];

        /* Update the tweak for the next block. */
        mbedtls_gf128mul_x_ble( tweak, tweak );

        output += 16;
        input += 16;
    }

    if( leftover )
    {
        /* If we are on the leftover bytes in a decrypt operation, we need to
         * use the previous tweak for these bytes (as saved in prev_tweak). */
        unsigned char *t = mode == MBEDTLS_AES_DECRYPT ? prev_tweak : tweak;

        /* We are now on the final part of the data unit, which doesn't divide
         * evenly by 16. It's time for ciphertext stealing. */
        size_t i;
        unsigned char *prev_output = output - 16;

        /* Copy ciphertext bytes from the previous block to our output for each
         * byte of cyphertext we won't steal. At the same time, copy the
         * remainder of the input for this final round (since the loop bounds
         * are the same). */
        for( i = 0; i < leftover; i++ )
        {
            output[i] = prev_output[i];
            tmp[i] = input[i] ^ t[i];
        }

        /* Copy ciphertext bytes from the previous block for input in this
         * round. */
        for( ; i < 16; i++ )
            tmp[i] = prev_output[i] ^ t[i];

        ret = mbedtls_aes_crypt_ecb( &ctx->crypt, mode, tmp, tmp );
        if( ret != 0 )
            return ret;

        /* Write the result back to the previous block, overriding the previous
         * output we copied. */
        for( i = 0; i < 16; i++ )
            prev_output[i] = tmp[i] ^ t[i];
    }

    return( 0 );
}